

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetConfidentialTxInfo
              (void *handle,char *tx_hex_string,char **txid,char **wtxid,char **wit_hash,
              uint32_t *size,uint32_t *vsize,uint32_t *weight,uint32_t *version,uint32_t *locktime)

{
  undefined1 uVar1;
  int iVar2;
  int32_t iVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  undefined8 *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int32_t *in_stack_00000018;
  uint32_t *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  ConfidentialTransaction *tx;
  ConfidentialTransactionController ctxc;
  char *work_wit_hash;
  char *work_wtxid;
  char *work_txid;
  int error_code;
  ConfidentialTransactionController *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  CfdError in_stack_fffffffffffffd8c;
  CfdException *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffdd0;
  ByteData256 local_218;
  Txid local_200;
  string local_1e0;
  ByteData256 local_1c0;
  Txid local_1a8;
  string local_188;
  Txid local_168;
  string local_148;
  ConfidentialTransaction *local_128;
  allocator local_119;
  string local_118 [32];
  ConfidentialTransactionController local_f8;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  char *local_18;
  int local_4;
  
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  uVar1 = cfd::capi::IsEmptyString(local_18);
  if (!(bool)uVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,local_18,&local_119);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController
              ((ConfidentialTransactionController *)
               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (string *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    local_128 = cfd::ConfidentialTransactionController::GetTransaction(&local_f8);
    if (local_20 != (undefined8 *)0x0) {
      cfd::core::AbstractTransaction::GetTxid(&local_168,&local_128->super_AbstractTransaction);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_148,&local_168);
      local_48 = cfd::capi::CreateString((string *)CONCAT17(uVar1,in_stack_fffffffffffffdd0));
      std::__cxx11::string::~string((string *)&local_148);
      cfd::core::Txid::~Txid((Txid *)0x5a5d85);
    }
    if (local_28 != (undefined8 *)0x0) {
      cfd::core::AbstractTransaction::GetWitnessHash
                (&local_1c0,&local_128->super_AbstractTransaction);
      cfd::core::Txid::Txid(&local_1a8,&local_1c0);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_188,&local_1a8);
      local_50 = cfd::capi::CreateString((string *)CONCAT17(uVar1,in_stack_fffffffffffffdd0));
      std::__cxx11::string::~string((string *)&local_188);
      cfd::core::Txid::~Txid((Txid *)0x5a5ec4);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5a5ed1);
    }
    if (local_30 != (undefined8 *)0x0) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash(&local_218,local_128);
      cfd::core::Txid::Txid(&local_200,&local_218);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_1e0,&local_200);
      local_58 = cfd::capi::CreateString((string *)CONCAT17(uVar1,in_stack_fffffffffffffdd0));
      std::__cxx11::string::~string((string *)&local_1e0);
      cfd::core::Txid::~Txid((Txid *)0x5a5fce);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5a5fdb);
    }
    if (local_38 != (int *)0x0) {
      iVar2 = (*(local_128->super_AbstractTransaction)._vptr_AbstractTransaction[4])();
      *local_38 = iVar2;
    }
    if (in_stack_00000008 != (int *)0x0) {
      iVar2 = (*(local_128->super_AbstractTransaction)._vptr_AbstractTransaction[5])();
      *in_stack_00000008 = iVar2;
    }
    if (in_stack_00000010 != (int *)0x0) {
      iVar2 = (*(local_128->super_AbstractTransaction)._vptr_AbstractTransaction[6])();
      *in_stack_00000010 = iVar2;
    }
    if (in_stack_00000018 != (int32_t *)0x0) {
      iVar3 = cfd::core::AbstractTransaction::GetVersion(&local_128->super_AbstractTransaction);
      *in_stack_00000018 = iVar3;
    }
    if (in_stack_00000020 != (uint32_t *)0x0) {
      uVar4 = cfd::core::AbstractTransaction::GetLockTime(&local_128->super_AbstractTransaction);
      *in_stack_00000020 = uVar4;
    }
    if (local_48 != (char *)0x0) {
      *local_20 = local_48;
    }
    if (local_50 != (char *)0x0) {
      *local_28 = local_50;
    }
    if (local_58 != (char *)0x0) {
      *local_30 = local_58;
    }
    local_4 = 0;
    cfd::ConfidentialTransactionController::~ConfidentialTransactionController
              (in_stack_fffffffffffffd70);
    return local_4;
  }
  local_80.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_80.filename = local_80.filename + 1;
  local_80.line = 0x193;
  local_80.funcname = "CfdGetConfidentialTxInfo";
  cfd::core::logger::warn<>(&local_80,"tx is null or empty.");
  local_a2 = 1;
  uVar5 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"Failed to parameter. tx is null or empty.",&local_a1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
             (string *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  local_a2 = 0;
  __cxa_throw(uVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxInfo(
    void* handle, const char* tx_hex_string, char** txid, char** wtxid,
    char** wit_hash, uint32_t* size, uint32_t* vsize, uint32_t* weight,
    uint32_t* version, uint32_t* locktime) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_wtxid = nullptr;
  char* work_wit_hash = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    const ConfidentialTransaction& tx = ctxc.GetTransaction();

    if (txid != nullptr) {
      work_txid = CreateString(tx.GetTxid().GetHex());
    }
    if (wtxid != nullptr) {
      work_wtxid = CreateString(Txid(tx.GetWitnessHash()).GetHex());
    }
    if (wit_hash != nullptr) {
      work_wit_hash = CreateString(Txid(tx.GetWitnessOnlyHash()).GetHex());
    }
    if (size != nullptr) {
      *size = tx.GetTotalSize();
    }
    if (vsize != nullptr) {
      *vsize = tx.GetVsize();
    }
    if (weight != nullptr) {
      *weight = tx.GetWeight();
    }
    if (version != nullptr) {
      *version = tx.GetVersion();
    }
    if (locktime != nullptr) {
      *locktime = tx.GetLockTime();
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_wtxid != nullptr) *wtxid = work_wtxid;
    if (work_wit_hash != nullptr) *wit_hash = work_wit_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_wtxid, &work_wit_hash);
  return error_code;
}